

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumMixTexture *
pbrt::SpectrumMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumMixTexture *pSVar3;
  uintptr_t iptr;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *local_a0;
  long local_90 [2];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"tex1","");
  local_38 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_a8,(string *)parameters,(SpectrumHandle *)local_60,
             (SpectrumType)&local_38,(Allocator)0x0);
  local_80[0].bits = (uintptr_t)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tex2","");
  local_40 = CONCAT44(extraout_var_00,iVar2) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_b8 + 8),(string *)parameters,
             (SpectrumHandle *)local_80,(SpectrumType)&local_40,(Allocator)0x0);
  local_a0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
              *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"amount","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_b8,(string *)parameters,0.5,
             (memory_resource *)&local_a0);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumMixTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->tex1).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)local_a8;
  (pSVar3->tex2).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_b8._8_8_;
  (pSVar3->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_b8._0_8_;
  if (local_a0 !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
       *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((long *)local_80[0].bits != local_70) {
    operator_delete((void *)local_80[0].bits,local_70[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return pSVar3;
}

Assistant:

SpectrumMixTexture *SpectrumMixTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    return alloc.new_object<SpectrumMixTexture>(
        parameters.GetSpectrumTexture("tex1", zero, SpectrumType::Reflectance, alloc),
        parameters.GetSpectrumTexture("tex2", one, SpectrumType::Reflectance, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}